

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void __thiscall QtMWidgets::MessageBox::removeButton(MessageBox *this,QAbstractButton *button)

{
  long lVar1;
  MessageBoxPrivate *pMVar2;
  QHBoxLayout *pQVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long unaff_R12;
  QAbstractButton *local_30;
  undefined8 local_28;
  
  pMVar2 = (this->d).d;
  if (pMVar2->okButton == (MsgBoxButton *)button) {
    return;
  }
  local_30 = button;
  bVar5 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::contains
                    (&pMVar2->buttonsMap,&local_30);
  if (!bVar5) {
    return;
  }
  pMVar2 = (this->d).d;
  lVar8 = (pMVar2->buttons).d.size;
  if (0 < lVar8) {
    lVar9 = -8;
    do {
      iVar10 = (int)unaff_R12;
      lVar1 = lVar8 * -8 + lVar9;
      if (lVar1 == -8) goto LAB_001617d7;
      unaff_R12 = lVar9 + 8;
      lVar4 = lVar9 + 8;
      lVar9 = unaff_R12;
    } while (*(QAbstractButton **)((long)(pMVar2->buttons).d.ptr + lVar4) != local_30);
    iVar10 = (int)(unaff_R12 >> 3);
LAB_001617d7:
    if (lVar1 != -8) goto LAB_001617e4;
  }
  iVar10 = -1;
LAB_001617e4:
  if (iVar10 != -1) {
    plVar6 = (long *)(**(code **)(*(long *)pMVar2->hbox + 0xb0))(pMVar2->hbox,iVar10 * 2);
    pQVar3 = ((this->d).d)->hbox;
    plVar7 = (long *)(**(code **)(*(long *)pQVar3 + 0xb0))(pQVar3,iVar10 * 2 + -1);
    lVar8 = (**(code **)(*plVar7 + 0x68))(plVar7);
    if (lVar8 != 0) {
      (**(code **)(*plVar7 + 0x68))(plVar7);
      QObject::deleteLater();
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    (**(code **)(*plVar7 + 8))(plVar7);
    QList<QAbstractButton_*>::removeAt(&((this->d).d)->buttons,(long)iVar10);
    QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::remove
              (&((this->d).d)->buttonsMap,(char *)&local_30);
    QList<QFrame_*>::removeAt(&((this->d).d)->buttonSeparators,(long)(iVar10 + -1));
    QObject::disconnect((QObject *)local_30,(char *)0x0,(QObject *)this,(char *)0x0);
    QObject::deleteLater();
    local_28 = (**(code **)(*(long *)((this->d).d)->vbox + 0xf0))();
    QWidget::resize((QSize *)this);
    MessageBoxPrivate::adjustSize((this->d).d);
  }
  return;
}

Assistant:

void
MessageBox::removeButton( QAbstractButton * button )
{
	if( d->okButton != button && d->buttonsMap.contains( button ) )
	{
		const int index = d->buttons.indexOf( button );

		if( index != -1 )
		{
			QLayoutItem * b = d->hbox->takeAt( index * 2 );
			QLayoutItem * l = d->hbox->takeAt( index * 2 - 1 );

			if( l->widget() )
				l->widget()->deleteLater();

			delete b;
			delete l;

			d->buttons.removeAt( index );
			d->buttonsMap.remove( button );
			d->buttonSeparators.removeAt( index - 1 );

			disconnect( button, 0, this, 0 );

			button->deleteLater();

			resize( d->vbox->sizeHint() );

			d->adjustSize();
		}
	}
}